

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBoxAlgo.h
# Opt level: O1

Vec3<float> __thiscall
Imath_3_2::closestPointOnBox<float>
          (Imath_3_2 *this,Vec3<float> *p,Box<Imath_3_2::Vec3<float>_> *box)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  Vec3<float> *pVVar9;
  Vec3<float> *q_1;
  int i;
  long lVar10;
  Box<Imath_3_2::Vec3<float>_> *pBVar11;
  Vec3<float> *q;
  int iVar12;
  float fVar13;
  int iVar14;
  float fVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Vec3<float> VVar21;
  Vec3<float> VVar22;
  Vec3<float> VVar23;
  
  fVar13 = (box->min).x;
  fVar15 = (box->max).x;
  uVar16 = (ulong)(uint)fVar15;
  if (((fVar15 < fVar13) ||
      (fVar17 = (box->min).y, pfVar1 = &(box->max).y, *pfVar1 <= fVar17 && fVar17 != *pfVar1)) ||
     (fVar17 = (box->min).z, pfVar1 = &(box->max).z, *pfVar1 <= fVar17 && fVar17 != *pfVar1)) {
    *(undefined8 *)this = *(undefined8 *)p;
    fVar15 = p->z;
  }
  else {
    lVar10 = 0;
    do {
      fVar17 = (&p->x)[lVar10];
      fVar18 = (&(box->min).x)[lVar10];
      if ((fVar17 < fVar18) || (fVar18 = (&(box->max).x)[lVar10], fVar18 < fVar17)) {
        *(float *)(this + lVar10 * 4) = fVar18;
      }
      else {
        *(float *)(this + lVar10 * 4) = fVar17;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    fVar17 = p->x;
    if (((*(float *)this != fVar17) || (NAN(*(float *)this) || NAN(fVar17))) ||
       ((*(float *)(this + 4) != p->y ||
        (((NAN(*(float *)(this + 4)) || NAN(p->y) || (*(float *)(this + 8) != p->z)) ||
         (NAN(*(float *)(this + 8)) || NAN(p->z))))))) goto LAB_0012cc03;
    fVar15 = fVar15 - fVar17;
    fVar17 = fVar17 - fVar13;
    fVar13 = fVar17;
    if (fVar15 <= fVar17) {
      fVar13 = fVar15;
    }
    uVar2 = p->y;
    uVar5 = p->z;
    uVar3 = (box->min).y;
    uVar6 = (box->min).z;
    uVar4 = (box->max).y;
    uVar7 = (box->max).z;
    fVar18 = (float)uVar4 - (float)uVar2;
    VVar22.z = (float)uVar2 - (float)uVar3;
    auVar19._4_4_ = (float)uVar5 - (float)uVar6;
    auVar19._0_4_ = VVar22.z;
    auVar19._8_8_ = 0;
    auVar20._4_4_ = (float)uVar7 - (float)uVar5;
    auVar20._0_4_ = fVar18;
    auVar20._8_8_ = 0;
    auVar20 = minps(auVar19,auVar20);
    iVar12 = -(uint)(fVar13 < auVar20._0_4_);
    iVar14 = -(uint)(fVar13 < auVar20._4_4_);
    auVar8._4_4_ = iVar12;
    auVar8._0_4_ = iVar12;
    auVar8._8_4_ = iVar14;
    auVar8._12_4_ = iVar14;
    iVar12 = movmskpd(3,auVar8);
    if (iVar12 == 3) {
      pBVar11 = (Box<Imath_3_2::Vec3<float>_> *)&box->max;
      if (fVar17 < fVar15) {
        pBVar11 = box;
      }
      fVar13 = (pBVar11->min).x;
      VVar22.y = 0.0;
      VVar22.x = fVar13;
      *(float *)this = fVar13;
      return VVar22;
    }
    if (auVar20._0_4_ < auVar20._4_4_) {
      pVVar9 = &box->min;
      if (fVar18 <= VVar22.z) {
        pVVar9 = &box->max;
      }
      VVar23.y = 0.0;
      VVar23.x = pVVar9->y;
      *(float *)(this + 4) = pVVar9->y;
      VVar23.z = VVar22.z;
      return VVar23;
    }
    fVar13 = (float)-(uint)(VVar22.z < fVar18);
    pVVar9 = &box->max;
    if ((float)uVar5 - (float)uVar6 < (float)uVar7 - (float)uVar5) {
      pVVar9 = &box->min;
    }
    fVar15 = pVVar9->z;
  }
  uVar16 = (ulong)(uint)fVar15;
  *(float *)(this + 8) = fVar15;
LAB_0012cc03:
  VVar21.z = fVar13;
  VVar21.x = (float)(int)uVar16;
  VVar21.y = (float)(int)(uVar16 >> 0x20);
  return VVar21;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 Vec3<T>
closestPointOnBox (const Vec3<T>& p, const Box<Vec3<T>>& box) IMATH_NOEXCEPT
{
    if (box.isEmpty ()) return p;

    Vec3<T> q = closestPointInBox (p, box);

    if (q == p)
    {
        Vec3<T> d1 = p - box.min;
        Vec3<T> d2 = box.max - p;

        Vec3<T> d (
            (d1.x < d2.x) ? d1.x : d2.x,
            (d1.y < d2.y) ? d1.y : d2.y,
            (d1.z < d2.z) ? d1.z : d2.z);

        if (d.x < d.y && d.x < d.z)
        {
            q.x = (d1.x < d2.x) ? box.min.x : box.max.x;
        }
        else if (d.y < d.z)
        {
            q.y = (d1.y < d2.y) ? box.min.y : box.max.y;
        }
        else
        {
            q.z = (d1.z < d2.z) ? box.min.z : box.max.z;
        }
    }

    return q;
}